

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::IsSSBInVSFSAvailable
          (ShaderImageLoadStoreBase *this,int required)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  GLint blocksFS;
  GLint blocksVS;
  ostringstream reason;
  int local_1c8;
  int local_1c4;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&local_1c4);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90da,&local_1c8);
  bVar1 = required <= local_1c4;
  bVar2 = required <= local_1c8;
  if (!bVar2 || !bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Required ",9);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," VS storage blocks but only ",0x1c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," available.",0xb);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Required ",9);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," FS storage blocks but only ",0x1c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," available.",0xb);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return bVar2 && bVar1;
}

Assistant:

bool IsSSBInVSFSAvailable(int required)
	{
		GLint blocksVS, blocksFS;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &blocksVS);
		glGetIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &blocksFS);
		if (blocksVS >= required && blocksFS >= required)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << required << " VS storage blocks but only " << blocksVS << " available."
				   << std::endl
				   << "Required " << required << " FS storage blocks but only " << blocksFS << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}